

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pools.cpp
# Opt level: O3

Value __thiscall xmrig::Pools::toJSON(Pools *this,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Document *pDVar1;
  long in_RDX;
  long extraout_RDX;
  Pool *pool;
  Document *doc_00;
  Value VVar2;
  
  allocator = *(MemoryPoolAllocator<rapidjson::CrtAllocator> **)(in_RDX + 0x10);
  this->m_retries = 0;
  this->m_retryPause = 0;
  (this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined2 *)
   ((long)&(this->m_data).super__Vector_base<xmrig::Pool,_std::allocator<xmrig::Pool>_>._M_impl.
           super__Vector_impl_data._M_start + 6) = 4;
  doc_00 = (Document *)
           (doc->
           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ).data_.o.members;
  pDVar1 = (Document *)doc->allocator_;
  if (doc_00 != pDVar1) {
    do {
      Pool::toJSON((Pool *)&stack0xffffffffffffffc0,doc_00);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          *)&stack0xffffffffffffffc0,allocator);
      doc_00 = (Document *)&doc_00[1].parseResult_.offset_;
      in_RDX = extraout_RDX;
    } while (doc_00 != pDVar1);
  }
  VVar2.data_.o.members = (Member *)in_RDX;
  VVar2.data_.n = (Number)this;
  return (Value)VVar2.data_;
}

Assistant:

rapidjson::Value xmrig::Pools::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value pools(kArrayType);

    for (const Pool &pool : m_data) {
        pools.PushBack(pool.toJSON(doc), allocator);
    }

    return pools;
}